

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VertexBuffer.cpp
# Opt level: O1

bool __thiscall sf::VertexBuffer::update(VertexBuffer *this,VertexBuffer *vertexBuffer)

{
  GLboolean GVar1;
  GLboolean GVar2;
  void *__dest;
  void *__src;
  GLenum GVar3;
  bool bVar4;
  TransientContextLock contextLock;
  TransientContextLock local_31;
  
  if ((this->m_buffer == 0) || (vertexBuffer->m_buffer == 0)) {
    bVar4 = false;
  }
  else {
    GlResource::TransientContextLock::TransientContextLock(&local_31);
    priv::ensureExtensionsInit();
    if (sfogl_ext_ARB_copy_buffer == 0) {
      (*sf_ptrc_glBindBufferARB)(0x8892,this->m_buffer);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/VertexBuffer.cpp"
                         ,0xe8,"GLEXT_glBindBuffer(GLEXT_GL_ARRAY_BUFFER, m_buffer)");
      GVar3 = 0x88e4;
      if (this->m_usage != Static) {
        GVar3 = (uint)(this->m_usage == Dynamic) * 8 + 0x88e0;
      }
      (*sf_ptrc_glBufferDataARB)(0x8892,vertexBuffer->m_size * 0x14,(void *)0x0,GVar3);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/VertexBuffer.cpp"
                         ,0xe9,
                         "GLEXT_glBufferData(GLEXT_GL_ARRAY_BUFFER, sizeof(Vertex) * vertexBuffer.m_size, 0, usageToGlEnum(m_usage))"
                        );
      __dest = (*sf_ptrc_glMapBufferARB)(0x8892,0x88b9);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/VertexBuffer.cpp"
                         ,0xec,
                         "destination = GLEXT_glMapBuffer(GLEXT_GL_ARRAY_BUFFER, GLEXT_GL_WRITE_ONLY)"
                        );
      (*sf_ptrc_glBindBufferARB)(0x8892,vertexBuffer->m_buffer);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/VertexBuffer.cpp"
                         ,0xee,"GLEXT_glBindBuffer(GLEXT_GL_ARRAY_BUFFER, vertexBuffer.m_buffer)");
      __src = (*sf_ptrc_glMapBufferARB)(0x8892,35000);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/VertexBuffer.cpp"
                         ,0xf1,
                         "source = GLEXT_glMapBuffer(GLEXT_GL_ARRAY_BUFFER, GLEXT_GL_READ_ONLY)");
      memcpy(__dest,__src,vertexBuffer->m_size * 0x14);
      GVar1 = (*sf_ptrc_glUnmapBufferARB)(0x8892);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/VertexBuffer.cpp"
                         ,0xf6,"sourceResult = GLEXT_glUnmapBuffer(GLEXT_GL_ARRAY_BUFFER)");
      (*sf_ptrc_glBindBufferARB)(0x8892,this->m_buffer);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/VertexBuffer.cpp"
                         ,0xf8,"GLEXT_glBindBuffer(GLEXT_GL_ARRAY_BUFFER, m_buffer)");
      GVar2 = (*sf_ptrc_glUnmapBufferARB)(0x8892);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/VertexBuffer.cpp"
                         ,0xfb,"destinationResult = GLEXT_glUnmapBuffer(GLEXT_GL_ARRAY_BUFFER)");
      (*sf_ptrc_glBindBufferARB)(0x8892,0);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/VertexBuffer.cpp"
                         ,0xfd,"GLEXT_glBindBuffer(GLEXT_GL_ARRAY_BUFFER, 0)");
      bVar4 = GVar2 != '\0' && GVar1 != '\0';
    }
    else {
      (*sf_ptrc_glBindBufferARB)(0x8f36,vertexBuffer->m_buffer);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/VertexBuffer.cpp"
                         ,0xdd,
                         "GLEXT_glBindBuffer(GLEXT_GL_COPY_READ_BUFFER, vertexBuffer.m_buffer)");
      (*sf_ptrc_glBindBufferARB)(0x8f37,this->m_buffer);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/VertexBuffer.cpp"
                         ,0xde,"GLEXT_glBindBuffer(GLEXT_GL_COPY_WRITE_BUFFER, m_buffer)");
      (*sf_ptrc_glCopyBufferSubData)(0x8f36,0x8f37,0,0,vertexBuffer->m_size * 0x14);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/VertexBuffer.cpp"
                         ,0xe0,
                         "GLEXT_glCopyBufferSubData(GLEXT_GL_COPY_READ_BUFFER, GLEXT_GL_COPY_WRITE_BUFFER, 0, 0, sizeof(Vertex) * vertexBuffer.m_size)"
                        );
      (*sf_ptrc_glBindBufferARB)(0x8f37,0);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/VertexBuffer.cpp"
                         ,0xe2,"GLEXT_glBindBuffer(GLEXT_GL_COPY_WRITE_BUFFER, 0)");
      (*sf_ptrc_glBindBufferARB)(0x8f36,0);
      bVar4 = true;
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/VertexBuffer.cpp"
                         ,0xe3,"GLEXT_glBindBuffer(GLEXT_GL_COPY_READ_BUFFER, 0)");
    }
    GlResource::TransientContextLock::~TransientContextLock(&local_31);
  }
  return bVar4;
}

Assistant:

bool VertexBuffer::update(const VertexBuffer& vertexBuffer)
{
#ifdef SFML_OPENGL_ES

    return false;

#else

    if (!m_buffer || !vertexBuffer.m_buffer)
        return false;

    TransientContextLock contextLock;

    // Make sure that extensions are initialized
    sf::priv::ensureExtensionsInit();

    if (GLEXT_copy_buffer)
    {
        glCheck(GLEXT_glBindBuffer(GLEXT_GL_COPY_READ_BUFFER, vertexBuffer.m_buffer));
        glCheck(GLEXT_glBindBuffer(GLEXT_GL_COPY_WRITE_BUFFER, m_buffer));

        glCheck(GLEXT_glCopyBufferSubData(GLEXT_GL_COPY_READ_BUFFER, GLEXT_GL_COPY_WRITE_BUFFER, 0, 0, sizeof(Vertex) * vertexBuffer.m_size));

        glCheck(GLEXT_glBindBuffer(GLEXT_GL_COPY_WRITE_BUFFER, 0));
        glCheck(GLEXT_glBindBuffer(GLEXT_GL_COPY_READ_BUFFER, 0));

        return true;
    }

    glCheck(GLEXT_glBindBuffer(GLEXT_GL_ARRAY_BUFFER, m_buffer));
    glCheck(GLEXT_glBufferData(GLEXT_GL_ARRAY_BUFFER, sizeof(Vertex) * vertexBuffer.m_size, 0, usageToGlEnum(m_usage)));

    void* destination = 0;
    glCheck(destination = GLEXT_glMapBuffer(GLEXT_GL_ARRAY_BUFFER, GLEXT_GL_WRITE_ONLY));

    glCheck(GLEXT_glBindBuffer(GLEXT_GL_ARRAY_BUFFER, vertexBuffer.m_buffer));

    void* source = 0;
    glCheck(source = GLEXT_glMapBuffer(GLEXT_GL_ARRAY_BUFFER, GLEXT_GL_READ_ONLY));

    std::memcpy(destination, source, sizeof(Vertex) * vertexBuffer.m_size);

    GLboolean sourceResult = GL_FALSE;
    glCheck(sourceResult = GLEXT_glUnmapBuffer(GLEXT_GL_ARRAY_BUFFER));

    glCheck(GLEXT_glBindBuffer(GLEXT_GL_ARRAY_BUFFER, m_buffer));

    GLboolean destinationResult = GL_FALSE;
    glCheck(destinationResult = GLEXT_glUnmapBuffer(GLEXT_GL_ARRAY_BUFFER));

    glCheck(GLEXT_glBindBuffer(GLEXT_GL_ARRAY_BUFFER, 0));

    if ((sourceResult == GL_FALSE) || (destinationResult == GL_FALSE))
        return false;

    return true;

#endif // SFML_OPENGL_ES
}